

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlSaveCtxtPtr xmlSaveToBuffer(xmlBufferPtr buffer,char *encoding,int options)

{
  xmlOutputBufferPtr pxVar1;
  xmlSaveCtxtPtr ret;
  int options_local;
  char *encoding_local;
  xmlBufferPtr buffer_local;
  
  buffer_local = (xmlBufferPtr)xmlNewSaveCtxt(encoding,options);
  if ((xmlSaveCtxtPtr)buffer_local == (xmlSaveCtxtPtr)0x0) {
    buffer_local = (xmlBufferPtr)0x0;
  }
  else {
    pxVar1 = xmlOutputBufferCreateBuffer(buffer,((xmlSaveCtxtPtr)buffer_local)->handler);
    ((xmlSaveCtxtPtr)buffer_local)->buf = pxVar1;
    if (((xmlSaveCtxtPtr)buffer_local)->buf == (xmlOutputBufferPtr)0x0) {
      xmlCharEncCloseFunc(((xmlSaveCtxtPtr)buffer_local)->handler);
      xmlFreeSaveCtxt((xmlSaveCtxtPtr)buffer_local);
      buffer_local = (xmlBufferPtr)0x0;
    }
  }
  return (xmlSaveCtxtPtr)buffer_local;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToBuffer(xmlBufferPtr buffer, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateBuffer(buffer, ret->handler);
    if (ret->buf == NULL) {
        xmlCharEncCloseFunc(ret->handler);
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}